

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.h
# Opt level: O0

int fy_emit_accum_utf8_put(fy_emit_accum *ea,int c)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  int ret;
  char *ss;
  size_t w;
  int c_local;
  fy_emit_accum *ea_local;
  
  sVar3 = fy_utf8_width(c);
  do {
    if (sVar3 <= ea->alloc - ea->next) {
      pvVar4 = fy_utf8_put(ea->accum + ea->next,ea->alloc - ea->next,c);
      if (pvVar4 == (void *)0x0) {
        return -1;
      }
      ea->next = sVar3 + ea->next;
      ea->utf8_count = ea->utf8_count + 1;
      _Var1 = fy_is_lb(c);
      if (_Var1) {
        ea->col = 0;
      }
      else {
        _Var1 = fy_is_tab(c);
        if (_Var1) {
          ea->col = (ea->ts - ea->col % ea->ts) + ea->col;
        }
        else {
          ea->col = ea->col + 1;
        }
      }
      return 0;
    }
    iVar2 = fy_emit_accum_grow(ea);
  } while (iVar2 == 0);
  return iVar2;
}

Assistant:

static inline int
fy_emit_accum_utf8_put(struct fy_emit_accum *ea, int c) {
    size_t w;
    char *ss;
    int ret;

    /* grow if needed */
    w = fy_utf8_width(c);
    while (w > (ea->alloc - ea->next)) {
        ret = fy_emit_accum_grow(ea);
        if (ret != 0)
            return ret;
    }
    ss = fy_utf8_put(ea->accum + ea->next, ea->alloc - ea->next, c);
    if (!ss)
        return -1;
    ea->next += w;
    ea->utf8_count++;
    if (fy_is_lb(c))
        ea->col = 0;
    else if (fy_is_tab(c))
        ea->col += (ea->ts - (ea->col % ea->ts));
    else
        ea->col++;

    return 0;
}